

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::TestcheckValidFormatFixturecheckValidFormat_AllSetFieldsValid::
~TestcheckValidFormatFixturecheckValidFormat_AllSetFieldsValid
          (TestcheckValidFormatFixturecheckValidFormat_AllSetFieldsValid *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE( checkValidFormatFixture, checkValidFormat_AllSetFieldsValid)
{
  object.addField( 5000 );
  object.addField( 5001 );
  object.addField( 5002 );
  object.addField( 5003 );
  object.addField( 5004 );
  object.addField( 5005 );
  object.addField( 5006 );
  object.addField( 5007 );
  object.addField( 5008 );
  object.addField( 5009 );
  object.addField( 5010 );
  object.addField( 5011 );
  object.addField( 5012 );
  object.addField( 5013 );
  object.addField( 5014 );
  object.addField( 5015 );
  object.addField( 5016 );
  object.addField( 5017 );
  object.addField( 5018 );
  object.addField( 5019 );
  object.addField( 5020 );
  object.addField( 5021 );
  object.addField( 5022 );
  object.addField( 5023 );
  object.addField( 5024 );
  object.addField( 5025 );
  object.addField( 5026 );
  object.addField( 5027 );
  object.addField( 5028 );
  object.addField( 5029 );

  object.addMsgField( MsgType_TestRequest, 5000 );
  object.addMsgField( MsgType_TestRequest, 5001 );
  object.addMsgField( MsgType_TestRequest, 5002 );
  object.addMsgField( MsgType_TestRequest, 5003 );
  object.addMsgField( MsgType_TestRequest, 5004 );
  object.addMsgField( MsgType_TestRequest, 5005 );
  object.addMsgField( MsgType_TestRequest, 5006 );
  object.addMsgField( MsgType_TestRequest, 5007 );
  object.addMsgField( MsgType_TestRequest, 5008 );
  object.addMsgField( MsgType_TestRequest, 5009 );
  object.addMsgField( MsgType_TestRequest, 5010 );
  object.addMsgField( MsgType_TestRequest, 5011 );
  object.addMsgField( MsgType_TestRequest, 5012 );
  object.addMsgField( MsgType_TestRequest, 5013 );
  object.addMsgField( MsgType_TestRequest, 5014 );
  object.addMsgField( MsgType_TestRequest, 5015 );
  object.addMsgField( MsgType_TestRequest, 5016 );
  object.addMsgField( MsgType_TestRequest, 5017 );
  object.addMsgField( MsgType_TestRequest, 5018 );
  object.addMsgField( MsgType_TestRequest, 5019 );
  object.addMsgField( MsgType_TestRequest, 5020 );
  object.addMsgField( MsgType_TestRequest, 5021 );
  object.addMsgField( MsgType_TestRequest, 5022 );
  object.addMsgField( MsgType_TestRequest, 5023 );
  object.addMsgField( MsgType_TestRequest, 5024 );
  object.addMsgField( MsgType_TestRequest, 5025 );
  object.addMsgField( MsgType_TestRequest, 5026 );
  object.addMsgField( MsgType_TestRequest, 5027 );
  object.addMsgField( MsgType_TestRequest, 5028 );
  object.addMsgField( MsgType_TestRequest, 5029 );


  object.addFieldType( 5000, TYPE::String );
  object.addFieldType( 5001, TYPE::MultipleValueString );
  object.addFieldType( 5002, TYPE::MultipleStringValue );
  object.addFieldType( 5003, TYPE::MultipleCharValue );
  object.addFieldType( 5004, TYPE::Exchange );
  object.addFieldType( 5005, TYPE::LocalMktDate );
  object.addFieldType( 5006, TYPE::Data );
  object.addFieldType( 5007, TYPE::MonthYear );
  object.addFieldType( 5008, TYPE::DayOfMonth );
  object.addFieldType( 5009, TYPE::Country );
  object.addFieldType( 5010, TYPE::TzTimeOnly );
  object.addFieldType( 5011, TYPE::TzTimeStamp );
  object.addFieldType( 5012, TYPE::XmlData );
  object.addFieldType( 5013, TYPE::Language );
  object.addFieldType( 5014, TYPE::Char );
  object.addFieldType( 5015, TYPE::Price );
  object.addFieldType( 5016, TYPE::Int );
  object.addFieldType( 5017, TYPE::Amt );
  object.addFieldType( 5018, TYPE::Qty );
  object.addFieldType( 5019, TYPE::Currency );
  object.addFieldType( 5020, TYPE::UtcTimeStamp );
  object.addFieldType( 5021, TYPE::Boolean );
  object.addFieldType( 5022, TYPE::Float );
  object.addFieldType( 5023, TYPE::PriceOffset );
  object.addFieldType( 5024, TYPE::UtcDate );
  object.addFieldType( 5025, TYPE::UtcTimeOnly );
  object.addFieldType( 5026, TYPE::NumInGroup );
  object.addFieldType( 5027, TYPE::Percentage );
  object.addFieldType( 5028, TYPE::SeqNum );
  object.addFieldType( 5029, TYPE::Length );


  FIX40::TestRequest message;
  message.setField(5000, "String");
  message.setField(5001, "MultipleValueString");
  message.setField(5002, "MultipleStringValue");
  message.setField(5003, "MultipleCharValue");
  message.setField(5004, "Exchange");
  message.setField(5005, "5/09/2019");
  message.setField(5006, "Data");
  message.setField(5007, "01");
  message.setField(5008, "19");
  message.setField(5009, "US");
  message.setField(5010, "10:10:10.10");
  message.setField(5011, "123456789");
  message.setField(5012, "<xmldata>data</data>");
  message.setField(5013, "English");
  message.setField(5014, "C");
  message.setField(5015, "1.00");
  message.setField(5016, "100");
  message.setField(5017, "100");
  message.setField(5018, "100");
  message.setField(5019, "USD");
  message.setField(5020, "20000426-12:05:06");
  message.setField(5021, "Y");
  message.setField(5022, "1.23");
  message.setField(5023, "1");
  message.setField(5024, "20000426");
  message.setField(5025, "12:05:06");
  message.setField(5026, "5");
  message.setField(5027, "0.0");
  message.setField(5028, "1");
  message.setField(5029, "1");

  try{
    object.validate( message );
  }
  catch ( IncorrectDataFormat& e){
    CHECK(false);
    throw e;
  }
}